

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nlsol_ex_nl.h
# Opt level: O0

void __thiscall
ExampleNLFeeder::
FeedSuffixes<mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,ExampleNLFeeder>>::SuffixWriterFactory>
          (ExampleNLFeeder *this,SuffixWriterFactory *swf)

{
  int iVar1;
  ExampleModel *pEVar2;
  SparseVectorWriter<int,_double> *in_RSI;
  ExampleNLFeeder *in_RDI;
  SuffixIntWriter sw_1;
  SuffixDblWriter sw;
  int i;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  ExampleNLFeeder *in_stack_ffffffffffffff80;
  SparseVectorWriter<int,_double> *in_stack_ffffffffffffff88;
  ExampleNLFeeder *in_stack_ffffffffffffff90;
  ExampleNLFeeder local_48 [2];
  SparseVectorWriter<int,_double> local_28;
  int local_14;
  SparseVectorWriter<int,_double> *local_10;
  
  local_14 = 0;
  local_10 = in_RSI;
  while( true ) {
    iVar1 = local_14;
    Model(in_RDI);
    if (0 < iVar1) break;
    pEVar2 = Model(in_RDI);
    if ((pEVar2->suf[local_14].kind_ & 4U) == 0) {
      Model(in_RDI);
      pEVar2 = Model(in_RDI);
      in_stack_ffffffffffffff7c = pEVar2->suf[local_14].kind_;
      Model(in_RDI);
      CountNNZ<std::vector<double,std::allocator<double>>>
                (in_stack_ffffffffffffff80,
                 (vector<double,_std::allocator<double>_> *)
                 CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      in_stack_ffffffffffffff80 = local_48;
      mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_ExampleNLFeeder>_>::SuffixWriterFactory::
      StartIntSuffix((SuffixWriterFactory *)in_stack_ffffffffffffff88,
                     (char *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
                     in_stack_ffffffffffffff78);
      Model(in_RDI);
      WriteDense2Sparse_Pure<mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,ExampleNLFeeder>>::SparseVectorWriter<int,int>,std::vector<double,std::allocator<double>>>
                (in_stack_ffffffffffffff90,(SparseVectorWriter<int,_int> *)in_stack_ffffffffffffff88
                 ,(vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff80);
      mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_ExampleNLFeeder>_>::
      SparseVectorWriter<int,_int>::~SparseVectorWriter((SparseVectorWriter<int,_int> *)local_48);
    }
    else {
      in_stack_ffffffffffffff88 = local_10;
      pEVar2 = Model(in_RDI);
      in_stack_ffffffffffffff90 = (ExampleNLFeeder *)pEVar2->suf[local_14].name_;
      Model(in_RDI);
      Model(in_RDI);
      CountNNZ<std::vector<double,std::allocator<double>>>
                (in_stack_ffffffffffffff80,
                 (vector<double,_std::allocator<double>_> *)
                 CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_ExampleNLFeeder>_>::SuffixWriterFactory::
      StartDblSuffix((SuffixWriterFactory *)in_stack_ffffffffffffff88,
                     (char *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
                     in_stack_ffffffffffffff78);
      Model(in_RDI);
      WriteDense2Sparse_Pure<mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,ExampleNLFeeder>>::SparseVectorWriter<int,double>,std::vector<double,std::allocator<double>>>
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                 (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff80);
      mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_ExampleNLFeeder>_>::
      SparseVectorWriter<int,_double>::~SparseVectorWriter(&local_28);
    }
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

void FeedSuffixes(SuffixWriterFactory& swf) {
    for (int i=0; i<Model().n_suf; ++i) {
      if (Model().suf[i].kind_ & 4) {     // double's
        auto sw = swf.StartDblSuffix(
              Model().suf[i].name_,
              Model().suf[i].kind_,
              CountNNZ(Model().suf[i].values_));
        WriteDense2Sparse_Pure(sw, Model().suf[i].values_);
      } else {                            // int's
        auto sw = swf.StartIntSuffix(
              Model().suf[i].name_,
              Model().suf[i].kind_,
              CountNNZ(Model().suf[i].values_));
        WriteDense2Sparse_Pure(sw, Model().suf[i].values_);
      }
    }
  }